

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O0

void __thiscall
hiberlite::db_atom<std::__cxx11::string>::loadValue<hiberlite::SQLiteSelect,int>
          (db_atom<std::__cxx11::string> *this,SQLiteSelect *res,int *arg)

{
  uchar *puVar1;
  allocator local_41;
  string local_40 [32];
  int *local_20;
  int *arg_local;
  SQLiteSelect *res_local;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = arg;
  arg_local = (int *)res;
  res_local = (SQLiteSelect *)this;
  puVar1 = SQLiteSelect::get_text(res,*arg);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,(char *)puVar1,&local_41);
  std::__cxx11::string::operator=(*(string **)(this + 8),local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void db_atom<std::string>::loadValue(Stmt& res, Arg& arg) {
	val = std::string((const char*)(res.get_text(arg)));
}